

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_linear.h
# Opt level: O3

void XrMatrix4x4f_CreateTranslationRotationScale
               (XrMatrix4x4f *result,XrVector3f *translation,XrQuaternionf *rotation,
               XrVector3f *scale)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  fVar1 = scale->x;
  fVar7 = scale->y;
  fVar8 = rotation->x;
  fVar14 = rotation->w;
  fVar13 = (fVar8 + fVar8) * fVar14;
  uVar2 = rotation->y;
  uVar4 = rotation->z;
  fVar9 = (float)uVar2 + (float)uVar2;
  fVar12 = (float)uVar4 + (float)uVar4;
  fVar10 = 1.0 - fVar8 * (fVar8 + fVar8);
  fVar11 = fVar10 - (float)uVar2 * fVar9;
  fVar17 = (1.0 - (float)uVar2 * fVar9) - (float)uVar4 * fVar12;
  fVar6 = fVar8 * fVar9 + fVar12 * fVar14;
  fVar22 = fVar8 * fVar12 - fVar14 * fVar9;
  fVar20 = fVar8 * fVar9 - fVar12 * fVar14;
  fVar10 = fVar10 - (float)uVar4 * fVar12;
  fVar25 = (float)uVar2 * fVar12 + fVar13;
  fVar21 = fVar8 * fVar12 + fVar14 * fVar9;
  fVar13 = (float)uVar2 * fVar12 - fVar13;
  fVar26 = fVar20 * 0.0;
  fVar14 = fVar10 * 0.0;
  fVar18 = fVar17 * 0.0;
  fVar19 = fVar18 + fVar26;
  fVar9 = fVar6 * 0.0;
  fVar12 = fVar9 + fVar14;
  fVar27 = fVar25 * 0.0;
  fVar23 = fVar22 * 0.0;
  fVar24 = fVar23 + fVar27;
  fVar28 = fVar21 * 0.0;
  fVar8 = scale->z;
  fVar29 = fVar13 * 0.0;
  fVar30 = fVar11 * 0.0;
  fVar26 = fVar17 * fVar1 + fVar26 + fVar28 + 0.0;
  fVar31 = fVar6 * fVar1 + fVar14 + fVar29 + 0.0;
  fVar14 = fVar31 * 0.0;
  fVar15 = fVar26 * 0.0;
  fVar16 = fVar15 + fVar14;
  fVar22 = fVar22 * fVar1 + fVar27 + fVar30 + 0.0;
  fVar6 = fVar22 * 0.0;
  fVar17 = fVar1 * 0.0 + 0.0 + 0.0;
  fVar1 = translation->z;
  uVar3 = translation->x;
  uVar5 = translation->y;
  *(ulong *)result->m =
       CONCAT44(fVar17 * (float)uVar5 + fVar6 + fVar31 + fVar15,
                fVar17 * (float)uVar3 + fVar6 + fVar26 + fVar14);
  result->m[2] = fVar1 * fVar17 + fVar22 + fVar16;
  fVar22 = fVar20 * fVar7 + fVar18 + fVar28 + 0.0;
  fVar10 = fVar10 * fVar7 + fVar9 + fVar29 + 0.0;
  result->m[3] = fVar16 + fVar6 + fVar17;
  fVar14 = fVar10 * 0.0;
  fVar9 = fVar22 * 0.0;
  fVar26 = fVar25 * fVar7 + fVar23 + fVar30 + 0.0;
  fVar6 = fVar7 * 0.0 + 0.0;
  fVar17 = fVar9 + fVar14;
  fVar7 = fVar26 * 0.0;
  *(ulong *)(result->m + 4) =
       CONCAT44(fVar6 * (float)uVar5 + fVar7 + fVar10 + fVar9,
                fVar6 * (float)uVar3 + fVar7 + fVar22 + fVar14);
  fVar22 = fVar21 * fVar8 + fVar19 + 0.0;
  fVar10 = fVar13 * fVar8 + fVar12 + 0.0;
  result->m[6] = fVar1 * fVar6 + fVar26 + fVar17;
  result->m[7] = fVar17 + fVar7 + fVar6;
  fVar7 = fVar10 * 0.0;
  fVar17 = fVar22 * 0.0;
  fVar14 = fVar11 * fVar8 + fVar24 + 0.0;
  fVar26 = fVar8 * 0.0 + 0.0 + 0.0;
  fVar13 = fVar17 + fVar7;
  fVar8 = fVar14 * 0.0;
  fVar9 = fVar19 + fVar28 + 0.0;
  fVar6 = fVar12 + fVar29 + 0.0;
  *(ulong *)(result->m + 8) =
       CONCAT44(fVar26 * (float)uVar5 + fVar8 + fVar10 + fVar17,
                fVar26 * (float)uVar3 + fVar8 + fVar22 + fVar7);
  result->m[10] = fVar1 * fVar26 + fVar14 + fVar13;
  fVar7 = fVar6 * 0.0;
  fVar10 = fVar9 * 0.0;
  fVar11 = fVar10 + fVar7;
  fVar12 = fVar24 + fVar30 + 0.0;
  fVar14 = fVar12 * 0.0;
  result->m[0xb] = fVar13 + fVar8 + fVar26;
  result->m[0xc] = fVar14 + fVar9 + fVar7 + (float)uVar3;
  result->m[0xd] = fVar14 + fVar6 + fVar10 + (float)uVar5;
  result->m[0xe] = fVar12 + fVar11 + fVar1;
  result->m[0xf] = fVar11 + fVar14 + 1.0;
  return;
}

Assistant:

inline static void XrMatrix4x4f_CreateTranslationRotationScale(XrMatrix4x4f* result, const XrVector3f* translation,
                                                               const XrQuaternionf* rotation, const XrVector3f* scale) {
    XrMatrix4x4f scaleMatrix;
    XrMatrix4x4f_CreateScale(&scaleMatrix, scale->x, scale->y, scale->z);

    XrMatrix4x4f rotationMatrix;
    XrMatrix4x4f_CreateFromQuaternion(&rotationMatrix, rotation);

    XrMatrix4x4f translationMatrix;
    XrMatrix4x4f_CreateTranslation(&translationMatrix, translation->x, translation->y, translation->z);

    XrMatrix4x4f combinedMatrix;
    XrMatrix4x4f_Multiply(&combinedMatrix, &rotationMatrix, &scaleMatrix);
    XrMatrix4x4f_Multiply(result, &translationMatrix, &combinedMatrix);
}